

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O2

void __thiscall
Js::ScriptFunction::ChangeEntryPoint
          (ScriptFunction *this,ProxyEntryPointInfo *entryPointInfo,JavascriptMethod entryPoint)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  FunctionProxy *pFVar5;
  FunctionBody *pFVar6;
  
  if (((this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
       super_RecyclableObject.type.ptr)->typeId != TypeIds_Function) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0xfa,"(this->GetTypeId() == TypeIds_Function)",
                                "this->GetTypeId() == TypeIds_Function");
    if (!bVar2) goto LAB_00be7c7d;
    *puVar4 = 0;
  }
  iVar3 = (*(this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x66])(this);
  if ((iVar3 != 0) && (checkCodeGenThunk == entryPoint)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0xfc,
                                "(!IsCrossSiteObject() || entryPoint != (Js::JavascriptMethod)checkCodeGenThunk)"
                                ,
                                "!IsCrossSiteObject() || entryPoint != (Js::JavascriptMethod)checkCodeGenThunk"
                               );
    if (!bVar2) goto LAB_00be7c7d;
    *puVar4 = 0;
  }
  if (entryPointInfo != (ProxyEntryPointInfo *)0x0) {
    pFVar5 = GetFunctionProxy(this);
    if (pFVar5 != (FunctionProxy *)0x0) goto LAB_00be7c44;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar4 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                              ,0xff,
                              "((entryPointInfo != nullptr && this->GetFunctionProxy() != nullptr))"
                              ,"(entryPointInfo != nullptr && this->GetFunctionProxy() != nullptr)")
  ;
  if (!bVar2) {
LAB_00be7c7d:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar4 = 0;
LAB_00be7c44:
  bVar2 = HasFunctionBody(this);
  if (bVar2) {
    pFVar6 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)this);
    bVar2 = (bool)(((pFVar6->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 2) >> 1);
  }
  else {
    bVar2 = false;
  }
  ScriptFunctionType::ChangeEntryPoint
            ((ScriptFunctionType *)
             (this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
             super_RecyclableObject.type.ptr,entryPointInfo,entryPoint,bVar2);
  return;
}

Assistant:

void ScriptFunction::ChangeEntryPoint(ProxyEntryPointInfo* entryPointInfo, JavascriptMethod entryPoint)
    {
        Assert(this->GetTypeId() == TypeIds_Function);
#if ENABLE_NATIVE_CODEGEN
        Assert(!IsCrossSiteObject() || entryPoint != (Js::JavascriptMethod)checkCodeGenThunk);
#endif

        Assert((entryPointInfo != nullptr && this->GetFunctionProxy() != nullptr));

        bool isAsmJS = HasFunctionBody() && this->GetFunctionBody()->GetIsAsmjsMode();
        this->GetScriptFunctionType()->ChangeEntryPoint(entryPointInfo, entryPoint, isAsmJS);
    }